

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAT.cpp
# Opt level: O3

optional<Storage::Disk::FAT::Volume> *
Storage::Disk::FAT::GetVolume
          (optional<Storage::Disk::FAT::Volume> *__return_storage_ptr__,
          shared_ptr<Storage::Disk::Disk> *disk)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  undefined2 uVar6;
  ushort uVar7;
  uint uVar8;
  pointer pvVar9;
  pointer puVar10;
  uchar *puVar11;
  uchar *puVar12;
  ushort uVar13;
  void *pvVar14;
  undefined3 uVar15;
  int iVar16;
  Sector *pSVar17;
  unsigned_short *puVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  unsigned_short uVar23;
  long lVar24;
  bool bVar25;
  vector<unsigned_char,_std::allocator<unsigned_char>_> source_fat;
  vector<unsigned_char,_std::allocator<unsigned_char>_> root_directory;
  Parser parser;
  undefined1 uStack_13d;
  undefined1 uStack_139;
  ushort uStack_134;
  undefined1 uStack_132;
  undefined1 uStack_131;
  undefined1 uStack_12d;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vStack_128;
  vector<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_> vStack_110;
  void *local_f8;
  void *pvStack_f0;
  long local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  vector<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_> local_b8;
  Directory local_98;
  Parser local_78;
  
  Encodings::MFM::Parser::Parser(&local_78,Double,disk);
  pSVar17 = Encodings::MFM::Parser::sector(&local_78,0,0,'\x01');
  if (((pSVar17 == (Sector *)0x0) ||
      (pvVar9 = (pSVar17->samples).
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      pvVar9 == (pSVar17->samples).
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)) ||
     ((ulong)((long)(pvVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start) < 0x200)) {
    (__return_storage_ptr__->super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>).
    _M_payload.super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
    super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_engaged = false;
  }
  else {
    bVar25 = false;
    vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = 0;
    vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_short *)0x0;
    vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    vStack_110.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    vStack_110.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = 0;
    vStack_110.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    vStack_110.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    vStack_110.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    vStack_110.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    puVar10 = (pvVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar4 = *(ushort *)(puVar10 + 0xb);
    uVar15 = *(undefined3 *)(puVar10 + 0xb);
    uVar5 = *(ushort *)(puVar10 + 0xe);
    bVar1 = puVar10[0x10];
    uVar6 = *(undefined2 *)(puVar10 + 0x13);
    uVar7 = *(ushort *)(puVar10 + 0x16);
    uVar8 = *(uint *)(puVar10 + 0x18);
    uStack_134 = (ushort)uVar8;
    uStack_132 = (undefined1)(uVar8 >> 0x10);
    uStack_131 = (undefined1)(uVar8 >> 0x18);
    if (puVar10[0x1fe] == 'U') {
      bVar25 = puVar10[0x1ff] == 0xaa;
    }
    iVar19 = (int)((uint)uVar4 + (uint)*(ushort *)(puVar10 + 0x11) * 0x20 + -1) / (int)(uint)uVar4;
    local_f8 = (void *)0x0;
    pvStack_f0 = (void *)0x0;
    local_e8 = 0;
    if (uVar7 != 0) {
      uVar21 = 0;
      do {
        uVar20 = (ulong)(ushort)(uVar8 >> 0x10);
        uVar22 = (ulong)(uVar5 + uVar21) / (ulong)uStack_134;
        pSVar17 = Encodings::MFM::Parser::sector
                            (&local_78,(int)(uVar22 % uVar20),(int)(uVar22 / uVar20),
                             (char)((ulong)(uVar5 + uVar21) % (ulong)uStack_134) + '\x01');
        if ((pSVar17 == (Sector *)0x0) ||
           (pvVar9 = (pSVar17->samples).
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           pvVar9 == (pSVar17->samples).
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)) {
LAB_00441f77:
          (__return_storage_ptr__->super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>).
          _M_payload.super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
          super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_engaged = false;
          goto LAB_00441f9c;
        }
        puVar11 = (pvVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        puVar12 = (pvVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        if ((long)puVar12 - (long)puVar11 != (ulong)uVar4) goto LAB_00441f77;
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (puVar11,puVar12,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8);
        uVar21 = uVar21 + 1;
      } while (uVar21 < uVar7);
      if (pvStack_f0 != local_f8) {
        uVar22 = 0;
        do {
          bVar2 = *(byte *)((long)local_f8 + uVar22 + 1);
          uVar13 = CONCAT11(bVar2,*(undefined1 *)((long)local_f8 + uVar22));
          bVar3 = *(byte *)((long)local_f8 + uVar22 + 2);
          local_b8.
          super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)(CONCAT62(local_b8.
                                  super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                                  ._M_impl.super__Vector_impl_data._M_start._2_6_,uVar13) &
                        0xffffffffffff0fff);
          puVar18 = (unsigned_short *)
                    CONCAT44(vStack_128.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             vStack_128.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
          if (vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
              .super__Vector_impl_data._M_finish == puVar18) {
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
            _M_realloc_insert<unsigned_short>
                      (&vStack_128,
                       (iterator)
                       vStack_128.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_finish,(unsigned_short *)&local_b8);
            puVar18 = (unsigned_short *)
                      CONCAT44(vStack_128.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                               vStack_128.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
          }
          else {
            *vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish = uVar13 & 0xfff;
            vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar23 = (unsigned_short)(((uint)bVar3 << 0x10 | (uint)bVar2 << 8) >> 0xc);
          local_b8.
          super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT62(local_b8.
                                 super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                                 ._M_impl.super__Vector_impl_data._M_start._2_6_,uVar23);
          if (vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
              .super__Vector_impl_data._M_finish == puVar18) {
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
            _M_realloc_insert<unsigned_short>
                      (&vStack_128,
                       (iterator)
                       vStack_128.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_finish,(unsigned_short *)&local_b8);
          }
          else {
            *vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish = uVar23;
            vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar22 = uVar22 + 3;
        } while (uVar22 < (ulong)((long)pvStack_f0 - (long)local_f8));
      }
    }
    local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (iVar19 != 0) {
      lVar24 = 0;
      do {
        iVar16 = (uint)uVar5 + (int)lVar24 + (uint)bVar1 * (uint)uVar7;
        uVar22 = (long)iVar16 / (long)(int)(uVar8 & 0xffff);
        uVar22 = (ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 | uVar22 & 0xffffffff;
        pSVar17 = Encodings::MFM::Parser::sector
                            (&local_78,(int)((long)uVar22 % (long)(int)(uVar8 >> 0x10)),
                             (int)((long)uVar22 / (long)(int)(uVar8 >> 0x10)),
                             (char)(iVar16 % (int)(uVar8 & 0xffff)) + '\x01');
        if ((pSVar17 == (Sector *)0x0) ||
           (pvVar9 = (pSVar17->samples).
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           pvVar9 == (pSVar17->samples).
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)) {
LAB_00441f7d:
          bVar25 = false;
          goto LAB_00441f7f;
        }
        puVar11 = (pvVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        puVar12 = (pvVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        if ((long)puVar12 - (long)puVar11 != (ulong)uVar4) goto LAB_00441f7d;
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (puVar11,puVar12,&local_d8);
        lVar24 = lVar24 + 1;
      } while (iVar19 != lVar24);
    }
    anon_unknown.dwarf_131d35a::directory_from(&local_98,&local_d8);
    local_b8.super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(vStack_110.
                           super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           vStack_110.
                           super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    vStack_110.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         SUB84(local_98.
               super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    vStack_110.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         (undefined4)
         ((ulong)local_98.
                 super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
    local_b8.super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(vStack_110.
                           super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           vStack_110.
                           super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_4_);
    local_b8.super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(vStack_110.
                           super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                           vStack_110.
                           super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
    vStack_110.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ =
         SUB84(local_98.
               super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
               ._M_impl.super__Vector_impl_data._M_start,0);
    vStack_110.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ =
         (undefined4)
         ((ulong)local_98.
                 super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 0x20);
    vStack_110.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ =
         SUB84(local_98.
               super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
               ._M_impl.super__Vector_impl_data._M_finish,0);
    vStack_110.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ =
         (undefined4)
         ((ulong)local_98.
                 super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                 ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
    local_98.super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>::~vector
              (&local_b8);
    std::vector<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>::~vector
              (&local_98);
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>)._M_payload.
                      super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
                      super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_payload + 0x10) =
         (ulong)CONCAT42((uint)uVar7 * (uint)bVar1 + (uint)uVar5 + iVar19,
                         CONCAT11(uStack_12d,bVar25)) << 0x10;
    *(ulong *)&(__return_storage_ptr__->
               super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>)._M_payload.
               super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
               super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_payload =
         CONCAT17(uStack_139,CONCAT16(bVar1,CONCAT24(uVar5,CONCAT13(uStack_13d,uVar15))));
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>)._M_payload.
                      super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
                      super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_payload + 8) =
         CONCAT17(uStack_131,CONCAT16(uStack_132,CONCAT24(uStack_134,CONCAT22(uVar7,uVar6))));
    *(ulong *)&(__return_storage_ptr__->
               super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>)._M_payload.
               super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
               super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_payload._M_value.fat.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl =
         CONCAT44(vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                  vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start._0_4_);
    *(pointer *)
     ((long)&(__return_storage_ptr__->super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>
             )._M_payload.super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
             super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_payload + 0x20) =
         vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>
             )._M_payload.super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
             super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_payload._M_value.fat.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_> + 0x10) =
         (pointer)CONCAT44(vStack_128.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           vStack_128.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = 0;
    vStack_128.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_short *)0x0;
    *(ulong *)&(__return_storage_ptr__->
               super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>)._M_payload.
               super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
               super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_payload._M_value.
               root_directory.
               super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
               ._M_impl =
         CONCAT44(vStack_110.
                  super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                  vStack_110.
                  super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_);
    *(pointer *)
     ((long)&(__return_storage_ptr__->super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>
             )._M_payload.super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
             super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_payload._M_value.
             root_directory.
             super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
     + 8) = (pointer)CONCAT44(vStack_110.
                              super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                              ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                              vStack_110.
                              super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                              ._M_impl.super__Vector_impl_data._M_finish._0_4_);
    *(pointer *)
     ((long)&(__return_storage_ptr__->super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>
             )._M_payload.super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
             super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_payload._M_value.
             root_directory.
             super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
     + 0x10) = (pointer)CONCAT44(vStack_110.
                                 super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                 vStack_110.
                                 super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    vStack_110.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    vStack_110.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    vStack_110.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    vStack_110.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = 0;
    vStack_110.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    vStack_110.
    super__Vector_base<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    bVar25 = true;
LAB_00441f7f:
    (__return_storage_ptr__->super__Optional_base<Storage::Disk::FAT::Volume,_false,_false>).
    _M_payload.super__Optional_payload<Storage::Disk::FAT::Volume,_true,_false,_false>.
    super__Optional_payload_base<Storage::Disk::FAT::Volume>._M_engaged = bVar25;
    if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_d8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
LAB_00441f9c:
    if (local_f8 != (void *)0x0) {
      operator_delete(local_f8,local_e8 - (long)local_f8);
    }
    std::vector<Storage::Disk::FAT::File,_std::allocator<Storage::Disk::FAT::File>_>::~vector
              (&vStack_110);
    pvVar14 = (void *)CONCAT44(vStack_128.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               vStack_128.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_4_);
    if (pvVar14 != (void *)0x0) {
      operator_delete(pvVar14,CONCAT44(vStack_128.
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                       vStack_128.
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                              (long)pvVar14);
    }
  }
  std::
  _Rb_tree<Storage::Disk::Track::Address,_std::pair<const_Storage::Disk::Track::Address,_std::map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>_>,_std::_Select1st<std::pair<const_Storage::Disk::Track::Address,_std::map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>_>_>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::map<int,_Storage::Encodings::MFM::Sector,_std::less<int>,_std::allocator<std::pair<const_int,_Storage::Encodings::MFM::Sector>_>_>_>_>_>
  ::~_Rb_tree(&local_78.sectors_by_address_by_track_._M_t);
  if (local_78.disk_.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.disk_.super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<FAT::Volume> FAT::GetVolume(const std::shared_ptr<Storage::Disk::Disk> &disk) {
	Storage::Encodings::MFM::Parser parser(Storage::Encodings::MFM::Density::Double, disk);

	// Grab the boot sector; that'll be enough to establish the volume.
	const Storage::Encodings::MFM::Sector *const boot_sector = parser.sector(0, 0, 1);
	if(!boot_sector || boot_sector->samples.empty() || boot_sector->samples[0].size() < 512) {
		return std::nullopt;
	}

	// Obtain volume details.
	const auto &data = boot_sector->samples[0];
	FAT::Volume volume;
	volume.bytes_per_sector = uint16_t(data[11] | (data[12] << 8));
	volume.sectors_per_cluster = data[13];
	volume.reserved_sectors = uint16_t(data[14] | (data[15] << 8));
	volume.fat_copies = data[16];
	const uint16_t root_directory_entries = uint16_t(data[17] | (data[18] << 8));
	volume.total_sectors = uint16_t(data[19] | (data[20] << 8));
	volume.sectors_per_fat = uint16_t(data[22] | (data[23] << 8));
	volume.sectors_per_track = uint16_t(data[24] | (data[25] << 8));
	volume.head_count = uint16_t(data[26] | (data[27] << 8));
	volume.correct_signature = data[510] == 0x55 && data[511] == 0xaa;

	const size_t root_directory_sectors = (root_directory_entries*32 + volume.bytes_per_sector - 1) / volume.bytes_per_sector;
	volume.first_data_sector = int(volume.reserved_sectors + volume.sectors_per_fat*volume.fat_copies + root_directory_sectors);

	// Grab the FAT.
	std::vector<uint8_t> source_fat;
	for(int c = 0; c < volume.sectors_per_fat; c++) {
		const int sector_number = volume.reserved_sectors + c;
		const auto address = volume.chs_for_sector(sector_number);

		const Storage::Encodings::MFM::Sector *const fat_sector =
			parser.sector(address.head, address.cylinder, uint8_t(address.sector));
		if(!fat_sector || fat_sector->samples.empty() || fat_sector->samples[0].size() != volume.bytes_per_sector) {
			return std::nullopt;
		}
		std::copy(fat_sector->samples[0].begin(), fat_sector->samples[0].end(), std::back_inserter(source_fat));
	}

	// Decode the FAT.
	// TODO: stop assuming FAT12 here.
	for(size_t c = 0; c < source_fat.size(); c += 3) {
		const uint32_t double_cluster = uint32_t(source_fat[c] + (source_fat[c + 1] << 8) + (source_fat[c + 2] << 16));
		volume.fat.push_back(uint16_t(double_cluster & 0xfff));
		volume.fat.push_back(uint16_t(double_cluster >> 12));
	}

	// Grab the root directory.
	std::vector<uint8_t> root_directory;
	for(size_t c = 0; c < root_directory_sectors; c++) {
		const auto sector_number = int(volume.reserved_sectors + c + volume.sectors_per_fat*volume.fat_copies);
		const auto address = volume.chs_for_sector(sector_number);

		const Storage::Encodings::MFM::Sector *const sector =
			parser.sector(address.head, address.cylinder, uint8_t(address.sector));
		if(!sector || sector->samples.empty() || sector->samples[0].size() != volume.bytes_per_sector) {
			return std::nullopt;
		}
		std::copy(sector->samples[0].begin(), sector->samples[0].end(), std::back_inserter(root_directory));
	}
	volume.root_directory = directory_from(root_directory);

	return volume;
}